

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall format::mtx_format_error::~mtx_format_error(mtx_format_error *this)

{
  ~mtx_format_error(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

mtx_format_error
  (
    std::string expected_format,
    std::string got_format,
    std::string filename = "Unknown",
    std::string msg = "Matrix format mismatch"
  )
  : mtx_error(filename, msg)
  {
   expected_format_ = expected_format;
   got_format_ = got_format;
  }